

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

int ON_InsertKnot(double knot_value,int knot_multiplicity,int cv_dim,int order,int cv_count,
                 int cv_stride,double *cv,double *knot,int *hint)

{
  size_t __n;
  double dVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  double *pdVar5;
  uint uVar6;
  char *sFormat;
  double *__dest;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  double *__src;
  int iVar16;
  void *pvVar17;
  int iVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  double *pdVar22;
  uint uVar23;
  double dVar25;
  double dVar26;
  double dVar27;
  ulong local_b8;
  ulong uVar24;
  
  if ((order < 2) || (cv_count < order || knot == (double *)0x0)) {
    sFormat = "ON_InsertKnot(): illegal input";
    iVar3 = 0x521;
    goto LAB_004bd08b;
  }
  if ((cv != (double *)0x0) && (cv_dim < 1 || cv_stride < cv_dim)) {
    sFormat = "ON_InsertKnot(): illegal input";
    iVar3 = 0x529;
    goto LAB_004bd08b;
  }
  if (order <= knot_multiplicity) {
    sFormat = "ON_InsertKnot(): requested knot_multiplicity > degree";
    iVar3 = 0x530;
    goto LAB_004bd08b;
  }
  if (hint == (int *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *hint;
  }
  iVar3 = ON_NurbsSpanIndex(order,cv_count,knot,knot_value,1,iVar3);
  __dest = cv + iVar3 * cv_stride;
  if (cv == (double *)0x0) {
    __dest = (double *)0x0;
  }
  __src = knot + iVar3;
  uVar7 = (ulong)(uint)order;
  dVar26 = __src[uVar7 - 2];
  dVar1 = (__src + (uVar7 - 2))[1];
  if ((dVar26 != dVar1) || (dVar25 = 0.0, NAN(dVar26) || NAN(dVar1))) {
    dVar27 = (ABS(dVar26 - dVar1) + ABS(dVar1) + ABS(dVar26)) * 1.490116119385e-08;
    dVar25 = 2.220446049250313e-16;
    if (2.220446049250313e-16 <= dVar27) {
      dVar25 = dVar27;
    }
  }
  if (((iVar3 == 0) && (knot_value < dVar1)) && (knot_value <= dVar25 + dVar26)) {
    sFormat = "ON_InsertKnot(): requested knot_value at start of NURBS domain";
    iVar3 = 0x544;
    goto LAB_004bd08b;
  }
  iVar16 = cv_count - iVar3;
  if (((iVar3 == iVar16 - order) && (dVar26 < knot_value)) && (dVar1 - dVar25 <= knot_value)) {
    sFormat = "ON_InsertKnot(): requested knot_value at end of NURBS domain";
    iVar3 = 0x54d;
    goto LAB_004bd08b;
  }
  uVar9 = (ulong)(order - 2);
  dVar26 = __src[uVar9];
  uVar23 = order - 1;
  uVar24 = (ulong)uVar23;
  dVar1 = __src[uVar24];
  if ((((dVar26 + dVar1) * 0.5 < knot_value) || (dVar27 = dVar26, dVar25 < ABS(knot_value - dVar26))
      ) && (dVar27 = knot_value, ABS(knot_value - dVar1) <= dVar25)) {
    dVar27 = dVar1;
  }
  if ((dVar27 != dVar26) || (NAN(dVar27) || NAN(dVar26))) {
    if (knot_multiplicity < 1 || dVar27 != dVar1) goto LAB_004bd2e0;
    uVar12 = 0;
    do {
      if ((__src[uVar24 + uVar12] != dVar27) || (NAN(__src[uVar24 + uVar12]) || NAN(dVar27)))
      goto LAB_004bd2e6;
      uVar12 = uVar12 + 1;
    } while ((uint)knot_multiplicity != uVar12);
LAB_004bd2dc:
    uVar12 = (ulong)(uint)knot_multiplicity;
  }
  else {
    if (0 < knot_multiplicity) {
      lVar15 = 0;
      do {
        if ((knot[(long)iVar3 + uVar9 + lVar15] != dVar27) ||
           (NAN(knot[(long)iVar3 + uVar9 + lVar15]) || NAN(dVar27))) {
          uVar12 = (ulong)(uint)-(int)lVar15;
          goto LAB_004bd2e6;
        }
        lVar15 = lVar15 + -1;
      } while ((ulong)(uint)knot_multiplicity + lVar15 != 0);
      goto LAB_004bd2dc;
    }
LAB_004bd2e0:
    uVar12 = 0;
  }
LAB_004bd2e6:
  iVar19 = knot_multiplicity - (int)uVar12;
  if (hint != (int *)0x0) {
    *hint = iVar19 + iVar3;
  }
  if (iVar19 < 1) {
    return 0;
  }
  uVar13 = iVar19 + uVar23 * 2;
  pvVar4 = onmalloc((long)(int)((iVar19 + order) * cv_dim + uVar13) << 3);
  if (pvVar4 == (void *)0x0) {
    sFormat = "ON_InsertKnot(): out of memory";
    iVar3 = 0x570;
LAB_004bd08b:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
               ,iVar3,"",sFormat);
    return 0;
  }
  memcpy(pvVar4,__src,(ulong)(uVar23 * 2) * 8);
  local_b8 = 0;
  lVar10 = (long)cv_dim;
  lVar15 = (long)cv_stride;
  if (__dest == (double *)0x0) {
    pvVar14 = (void *)0x0;
  }
  else {
    pvVar14 = (void *)((ulong)uVar13 * 8 + (long)pvVar4);
    uVar12 = uVar7;
    pvVar20 = pvVar14;
    pdVar22 = __dest;
    do {
      memcpy(pvVar20,pdVar22,lVar10 * 8);
      pdVar22 = pdVar22 + lVar15;
      pvVar20 = (void *)((long)pvVar20 + lVar10 * 8);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  pdVar22 = __src + uVar24;
  __n = lVar10 * 8;
  do {
    uVar13 = (uint)local_b8;
    if ((dVar27 < *(double *)((long)pvVar4 + uVar7 * 8 + -0x10)) ||
       (*(double *)((long)pvVar4 + uVar24 * 8) <= dVar27)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                 ,0x4cb,"","ON_InsertSingleKnot() - illegal knot input");
LAB_004bd74a:
      pvVar4 = (void *)((long)pvVar4 + local_b8 * -8);
      if (uVar13 != 0) {
        iVar19 = uVar13 * cv_stride;
        pvVar20 = (void *)((long)pvVar14 + (long)iVar19 * -8);
        goto LAB_004bd782;
      }
      uVar13 = 0;
      goto LAB_004bd8c3;
    }
    if ((cv_dim < 1) && (pvVar14 != (void *)0x0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                 ,0x4d1,"","ON_InsertSingleKnot() - illegal cv input");
      goto LAB_004bd74a;
    }
    pdVar5 = (double *)((long)pvVar4 + (ulong)(uVar23 * 2) * 8);
    uVar12 = uVar24;
    uVar6 = uVar23;
    while (uVar6 != 0) {
      *pdVar5 = pdVar5[-1];
      uVar6 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar6;
      pdVar5 = pdVar5 + -1;
    }
    *pdVar5 = dVar27;
    if (pvVar14 != (void *)0x0) {
      pvVar20 = (void *)((long)pvVar14 + (long)(order * cv_dim) * 8);
      memcpy(pvVar20,(void *)((long)pvVar14 + (long)(int)(uVar23 * cv_dim) * 8),__n);
      pdVar5 = (double *)((long)pvVar4 + uVar24 * 8 + -8);
      pdVar8 = (double *)((long)pvVar4 + uVar7 * 8 + uVar24 * 8 + -8);
      pvVar17 = (void *)((long)pvVar20 + lVar10 * -8);
      uVar12 = uVar9;
      uVar6 = uVar23;
      if (dVar27 - *(double *)((long)pvVar4 + uVar24 * 8 + -8) <= *pdVar8 - dVar27) {
        while (uVar6 != 0) {
          if (cv_dim != 0) {
            dVar26 = (dVar27 - *pdVar5) / (*pdVar8 - *pdVar5);
            pvVar11 = pvVar17;
            pvVar21 = pvVar20;
            iVar18 = cv_dim;
            do {
              pvVar20 = (void *)((long)pvVar21 + -8);
              pvVar17 = (void *)((long)pvVar11 + -8);
              *(double *)((long)pvVar21 + -8) =
                   *(double *)((long)pvVar21 + -8) * dVar26 +
                   *(double *)((long)pvVar11 + -8) * (1.0 - dVar26);
              iVar18 = iVar18 + -1;
              pvVar11 = pvVar17;
              pvVar21 = pvVar20;
            } while (iVar18 != 0);
          }
          pdVar5 = pdVar5 + -1;
          pdVar8 = pdVar8 + -1;
          uVar6 = (uint)uVar12;
          uVar12 = (ulong)(uVar6 - 1);
        }
      }
      else {
        while (uVar6 != 0) {
          if (cv_dim != 0) {
            dVar26 = (*pdVar8 - dVar27) / (*pdVar8 - *pdVar5);
            pvVar11 = pvVar17;
            pvVar21 = pvVar20;
            iVar18 = cv_dim;
            do {
              pvVar20 = (void *)((long)pvVar21 + -8);
              pvVar17 = (void *)((long)pvVar11 + -8);
              *(double *)((long)pvVar21 + -8) =
                   *(double *)((long)pvVar21 + -8) * (1.0 - dVar26) +
                   *(double *)((long)pvVar11 + -8) * dVar26;
              iVar18 = iVar18 + -1;
              pvVar11 = pvVar17;
              pvVar21 = pvVar20;
            } while (iVar18 != 0);
          }
          pdVar5 = pdVar5 + -1;
          pdVar8 = pdVar8 + -1;
          uVar6 = (uint)uVar12;
          uVar12 = (ulong)(uVar6 - 1);
        }
      }
    }
    pvVar20 = (void *)((long)pvVar14 + lVar15 * 8);
    if (pvVar14 == (void *)0x0) {
      pvVar20 = pvVar14;
    }
    pvVar4 = (void *)((long)pvVar4 + 8);
    uVar13 = uVar13 + 1;
    local_b8 = (ulong)uVar13;
    bVar2 = 1 < iVar19;
    pvVar14 = pvVar20;
    iVar19 = iVar19 + -1;
  } while (bVar2);
  pvVar4 = (void *)((long)pvVar4 + local_b8 * -8);
  iVar19 = uVar13 * cv_stride;
  pvVar20 = (void *)((long)pvVar20 + (long)iVar19 * -8);
LAB_004bd782:
  if (iVar16 == order) {
    memcpy(pdVar22,(void *)((long)pvVar4 + uVar24 * 8),(ulong)(uVar23 + uVar13) << 3);
    if (__dest == (double *)0x0) goto LAB_004bd8c3;
  }
  else {
    iVar18 = (iVar3 + order) - cv_count;
    do {
      __src[(int)((uVar13 - 3) + order + iVar16)] = __src[iVar16 + order + -3];
      __src = __src + -1;
      iVar18 = iVar18 + 1;
    } while (iVar18 != 0);
    memcpy(pdVar22,(void *)((long)pvVar4 + uVar24 * 8),(ulong)(uVar23 + uVar13) << 3);
    if (__dest == (double *)0x0) goto LAB_004bd8c3;
    if (iVar16 != order) {
      iVar16 = (iVar16 + -1) * cv_stride;
      iVar3 = (iVar3 + order) - cv_count;
      do {
        memcpy(__dest + (iVar19 + iVar16),__dest + iVar16,__n);
        iVar16 = iVar16 - cv_stride;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0);
    }
  }
  iVar3 = order + uVar13;
  if (iVar3 != 0 && SCARRY4(order,uVar13) == iVar3 < 0) {
    do {
      memcpy(__dest,pvVar20,__n);
      pvVar20 = (void *)((long)pvVar20 + __n);
      __dest = __dest + lVar15;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
LAB_004bd8c3:
  onfree(pvVar4);
  return uVar13;
}

Assistant:

int ON_InsertKnot( 
        double knot_value, 
        int knot_multiplicity, 
        int cv_dim,   // dimension of cv's = ( = dim+1 for rational cvs )
        int order, 
        int cv_count,
        int cv_stride, 
        double* cv,   // nullptr or cv array with room for at least knot_multiplicity new cvs
        double* knot, // knot array with room for at least knot_multiplicity new knots
        int* hint     // optional hint about where to search for span to add knots to
                      // pass nullptr if no hint is available
        )
{
  int rc = 0; // return code = number of knots added

  if ( order < 2 || cv_count < order || !knot ) 
  {
    ON_ERROR("ON_InsertKnot(): illegal input" );
    return 0;
  }

  if ( cv ) 
  {
    if ( cv_dim < 1 || cv_stride < cv_dim ) 
    {
      ON_ERROR("ON_InsertKnot(): illegal input" );
      return 0;
    }
  }

  if ( knot_multiplicity >= order ) 
  {
    ON_ERROR("ON_InsertKnot(): requested knot_multiplicity > degree" );
    return 0;
  }

  // shift knot vector and cv array so that knot_value lies in first span
  int span_index = ON_NurbsSpanIndex( order, cv_count, knot, knot_value, 1, hint?*hint:0 );
  knot += span_index;
  if ( cv )
    cv += (span_index*cv_stride);
  cv_count -= span_index;

  const double knot_tolerance = ON_SpanTolerance( order, cv_count, knot, 0 );

  // check that knot_value is interior to NURBS domain
  if ( span_index == 0 ) 
  {
    if ( knot_value < knot[order-1] ) 
    {
      if ( knot_value <= knot[order-2] + knot_tolerance ) 
      {
        ON_ERROR("ON_InsertKnot(): requested knot_value at start of NURBS domain" );
        return 0;
      }
    }
  }
  if ( span_index == cv_count-order ) 
  {
    if ( knot_value > knot[order-2] && knot_value >= knot[order-1] - knot_tolerance ) 
    {
      ON_ERROR("ON_InsertKnot(): requested knot_value at end of NURBS domain" );
      return 0;
    }
  }

  // if knot_value is nearly equal to an existing knot, make it exactly equal
  if ( knot_value <= 0.5*(knot[order-2]+knot[order-1]) && fabs( knot_value - knot[order-2] ) <= knot_tolerance ) {
    knot_value = knot[order-2];
  }
  else if ( fabs( knot_value - knot[order-1] ) <= knot_tolerance ) {
    knot_value = knot[order-1];
  }

  const int degree = order-1;

  // set m = number of knots to add
  int m = 0; 
  int j;
  if ( knot_value == knot[order-2] ) {
    for ( j = order-2; m < knot_multiplicity && knot[j-m] == knot_value; m++ )
      ; // empty for
  }
  else if ( knot_value == knot[order-1] ) {
    for ( j = order-1; m < knot_multiplicity && knot[j+m] == knot_value; m++ )
      ; // empty for
  }
  m = knot_multiplicity - m;
  if ( hint )
    *hint = span_index+m;

  if ( m <= 0 )
    return 0; // no knots need to be added

  double* new_knot = (double*)onmalloc( ((2*degree+m) + (order+m)*cv_dim)*sizeof(*new_knot) );
  if ( !new_knot ) {
    ON_ERROR("ON_InsertKnot(): out of memory");
    return 0;
  }
  double* new_cv = 0;
  memcpy( new_knot, knot, 2*degree*sizeof(*new_knot) );
  if ( cv ) {
    new_cv = new_knot + (2*degree+m);
    for ( j = 0; j < order; j++ ) {
      memcpy( new_cv + j*cv_dim, cv + j*cv_stride, cv_dim*sizeof(*new_cv) );
    }
  }

  // add m more knots at knot_value
  rc = 0;
  while (m>0) {
    if ( !ON_InsertSingleKnot(cv_dim,order,cv_dim,new_cv,new_knot,knot_value) )
      break;
    m--;
    if ( new_cv )
      new_cv += cv_stride; 
    new_knot++; 
    rc++;
  }
  new_knot -= rc;
  new_cv -= rc*cv_stride;

  if ( rc > 0 ) 
  {
    // make room for rc many new knots
    int i0 = ON_KnotCount( order, cv_count ) - 1; // knot[i0] = last input knot
    int i1 = i0 + rc;
    int j_local  = (cv_count-order);
    while (j_local--)
      knot[i1--] = knot[i0--];
    
    // update knot vector
    memcpy ( knot+degree, new_knot+degree, (degree+rc)*sizeof(*new_knot) );

    if ( cv ) {
      // make room for rc many new CVs
      i0 = (cv_count-1)*cv_stride;             // cv[i0] = last coord of last input cv */
      i1 = i0 + rc*cv_stride;
      j_local = cv_count-order;
      while (j_local--) {
        memcpy( cv+i1, cv+i0, cv_dim*sizeof(*cv) );
        i1 -= cv_stride;
        i0 -= cv_stride;
      }

      // update cv values
      for ( j_local = 0; j_local < order+rc; j_local++ ) {
        memcpy( cv, new_cv, cv_dim*sizeof(*new_cv) );
        cv += cv_stride;
        new_cv += cv_dim;
      }
    }

  }

  onfree(new_knot);

  return rc;
}